

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_slider.c
# Opt level: O0

void slider_draw_new(t_slider *x,_glist *glist)

{
  _glist *p_Var1;
  undefined8 in_stack_fffffffffffffe90;
  uint uVar3;
  ulong uVar2;
  undefined8 in_stack_fffffffffffffe98;
  uint uVar5;
  ulong uVar4;
  char **local_148;
  char *tags [4];
  char tag_object [128];
  char tag [128];
  _glist *canvas;
  _glist *glist_local;
  t_slider *x_local;
  
  uVar5 = (uint)((ulong)in_stack_fffffffffffffe98 >> 0x20);
  uVar3 = (uint)((ulong)in_stack_fffffffffffffe90 >> 0x20);
  p_Var1 = glist_getcanvas(glist);
  local_148 = tags + 3;
  tags[0] = tag_object + 0x78;
  tags[1] = "label";
  tags[2] = "text";
  sprintf((char *)(tags + 3),"%lxOBJ",x);
  sprintf(tag_object + 0x78,"%lxBASE",x);
  uVar2 = (ulong)uVar3 << 0x20;
  uVar4 = (ulong)uVar5 << 0x20;
  pdgui_vmess((char *)0x0,"crr iiii rS",p_Var1,"create","rectangle",0,0,uVar2,uVar4,"-tags",2,
              &local_148);
  sprintf(tag_object + 0x78,"%lxKNOB",x);
  pdgui_vmess((char *)0x0,"crr iiii rS",p_Var1,"create","rectangle",0,0,uVar2 & 0xffffffff00000000,
              uVar4 & 0xffffffff00000000,"-tags",2,&local_148);
  sprintf(tag_object + 0x78,"%lxLABEL",x);
  pdgui_vmess((char *)0x0,"crr ii rs rS",p_Var1,"create","text",0,0,"-anchor","w","-tags",4,
              &local_148);
  slider_draw_config(x,glist);
  (*(x->x_gui).x_draw)(x,(x->x_gui).x_glist,6);
  return;
}

Assistant:

static void slider_draw_new(t_slider *x, t_glist *glist)
{
    t_canvas *canvas = glist_getcanvas(glist);
    char tag[128], tag_object[128];
    char*tags[] = {tag_object, tag, "label", "text"};
    sprintf(tag_object, "%lxOBJ", x);


    sprintf(tag, "%lxBASE", x);
    pdgui_vmess(0, "crr iiii rS", canvas, "create", "rectangle",
         0, 0, 0, 0, "-tags", 2, tags);

    sprintf(tag, "%lxKNOB", x);
    pdgui_vmess(0, "crr iiii rS", canvas, "create", "rectangle",
         0, 0, 0, 0, "-tags", 2, tags);

    sprintf(tag, "%lxLABEL", x);
    pdgui_vmess(0, "crr ii rs rS", canvas, "create", "text",
         0, 0, "-anchor", "w", "-tags", 4, tags);

    slider_draw_config(x, glist);
    (*x->x_gui.x_draw)(x, x->x_gui.x_glist, IEM_GUI_DRAW_MODE_IO);
}